

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_util.cc
# Opt level: O0

bool DoSplitHandshake(UniquePtr<SSL> *ssl,SettingsWriter *writer,bool is_resume)

{
  BIO *pBVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  SSL *pSVar6;
  BIO *pBVar7;
  BIO *pBVar8;
  pointer psVar9;
  TestConfig *config_00;
  __uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true> session;
  uchar *data;
  size_type len;
  pointer src;
  TestState *pTVar10;
  Span<const_unsigned_char> SVar11;
  Span<const_unsigned_char> handback_00;
  byte local_165;
  unique_ptr<TestState,_std::default_delete<TestState>_> local_c8;
  undefined1 local_c0 [8];
  CBS handback;
  CBS output;
  undefined1 local_98 [8];
  UniquePtr<SSL> ssl_handback;
  SSL_CTX *ctx;
  Span<const_unsigned_char> local_80;
  undefined1 local_70 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  TestConfig *config;
  vector<unsigned_char,_std::allocator<unsigned_char>_> handshaker_input;
  bool is_resume_local;
  SettingsWriter *writer_local;
  UniquePtr<SSL> *ssl_local;
  
  handshaker_input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = is_resume;
  pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(ssl);
  pBVar7 = SSL_get_rbio(pSVar6);
  pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(ssl);
  pBVar8 = SSL_get_wbio(pSVar6);
  if (pBVar7 != pBVar8) {
    __assert_fail("SSL_get_rbio(ssl->get()) == SSL_get_wbio(ssl->get())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/handshake_util.cc"
                  ,0x29e,"bool DoSplitHandshake(UniquePtr<SSL> *, SettingsWriter *, bool)");
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&config);
  psVar9 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(ssl);
  config_00 = GetTestConfig(psVar9);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
  psVar9 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(ssl);
  bVar3 = PrepareHandoff(psVar9,writer,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&config);
  if (bVar3) {
    pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(ssl);
    pBVar7 = SSL_get_rbio(pSVar6);
    bVar2 = handshaker_input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
    bssl::Span<unsigned_char_const>::
    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<unsigned_char_const> *)&local_80,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&config);
    bVar3 = RunHandshaker((BIO *)pBVar7,config_00,(bool)(bVar2 & 1),local_80,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
    if (bVar3) {
      pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(ssl);
      session.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
           (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)SSL_get_SSL_CTX(pSVar6);
      ssl_handback._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
           session.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl;
      std::unique_ptr<TestState,std::default_delete<TestState>>::
      unique_ptr<std::default_delete<TestState>,void>
                ((unique_ptr<TestState,std::default_delete<TestState>> *)&output.len,(nullptr_t)0x0)
      ;
      TestConfig::NewSSL((TestConfig *)local_98,(SSL_CTX *)config_00,
                         (SSL_SESSION *)
                         session.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                         (unique_ptr<TestState,_std::default_delete<TestState>_> *)0x0);
      std::unique_ptr<TestState,_std::default_delete<TestState>_>::~unique_ptr
                ((unique_ptr<TestState,_std::default_delete<TestState>_> *)&output.len);
      bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_98);
      if (bVar3) {
        data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
        len = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
        CBS_init((CBS *)&handback.len,data,len);
        bVar3 = false;
        iVar5 = CBS_get_u24_length_prefixed((CBS *)&handback.len,(CBS *)local_c0);
        local_165 = 1;
        if (iVar5 != 0) {
          bVar4 = DeserializeContextState
                            ((CBS *)&handback.len,
                             (SSL_CTX *)
                             ssl_handback._M_t.
                             super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
          local_165 = 1;
          if (bVar4) {
            psVar9 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)local_98);
            TestState::Deserialize
                      ((TestState *)&local_c8,(CBS *)&handback.len,
                       (SSL_CTX *)
                       ssl_handback._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t
                       .super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
            bVar3 = true;
            bVar4 = SetTestState(psVar9,&local_c8);
            local_165 = 1;
            if (bVar4) {
              psVar9 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)local_98);
              pTVar10 = GetTestState(psVar9);
              local_165 = 1;
              if (pTVar10 != (TestState *)0x0) {
                SVar11 = cbs_st::operator_cast_to_Span((cbs_st *)local_c0);
                bVar4 = SettingsWriter::WriteHandback(writer,SVar11);
                local_165 = 1;
                if (bVar4) {
                  psVar9 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)local_98);
                  SVar11 = cbs_st::operator_cast_to_Span((cbs_st *)local_c0);
                  handback_00.data_ = (uchar *)SVar11.size_;
                  handback_00.size_ = (size_t)SVar11.data_;
                  bVar4 = bssl::SSL_apply_handback((bssl *)psVar9,(SSL *)SVar11.data_,handback_00);
                  local_165 = bVar4 ^ 0xff;
                }
              }
            }
          }
        }
        if (bVar3) {
          std::unique_ptr<TestState,_std::default_delete<TestState>_>::~unique_ptr(&local_c8);
        }
        if ((local_165 & 1) == 0) {
          psVar9 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)local_98);
          src = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(ssl);
          MoveBIOs(psVar9,src);
          psVar9 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(ssl);
          pTVar10 = GetTestState(psVar9);
          pBVar1 = pTVar10->async_bio;
          psVar9 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)local_98);
          pTVar10 = GetTestState(psVar9);
          pTVar10->async_bio = pBVar1;
          psVar9 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(ssl);
          pTVar10 = GetTestState(psVar9);
          pTVar10->async_bio = (BIO *)0x0;
          std::unique_ptr<ssl_st,_bssl::internal::Deleter>::operator=
                    (ssl,(unique_ptr<ssl_st,_bssl::internal::Deleter> *)local_98);
          ssl_local._7_1_ = true;
        }
        else {
          fprintf(_stderr,"Handback failed.\n");
          ssl_local._7_1_ = false;
        }
      }
      else {
        ssl_local._7_1_ = false;
      }
      std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)local_98);
      goto LAB_0012df5f;
    }
  }
  fprintf(_stderr,"Handoff failed.\n");
  ssl_local._7_1_ = false;
LAB_0012df5f:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&config);
  return ssl_local._7_1_;
}

Assistant:

bool DoSplitHandshake(UniquePtr<SSL> *ssl, SettingsWriter *writer,
                      bool is_resume) {
  assert(SSL_get_rbio(ssl->get()) == SSL_get_wbio(ssl->get()));
  std::vector<uint8_t> handshaker_input;
  const TestConfig *config = GetTestConfig(ssl->get());
  // out is the response from the handshaker, which includes a serialized
  // handback message, but also serialized updates to the |TestState|.
  std::vector<uint8_t> out;
  if (!PrepareHandoff(ssl->get(), writer, &handshaker_input) ||
      !RunHandshaker(SSL_get_rbio(ssl->get()), config, is_resume,
                     handshaker_input, &out)) {
    fprintf(stderr, "Handoff failed.\n");
    return false;
  }

  SSL_CTX *ctx = SSL_get_SSL_CTX(ssl->get());
  UniquePtr<SSL> ssl_handback = config->NewSSL(ctx, nullptr, nullptr);
  if (!ssl_handback) {
    return false;
  }
  CBS output, handback;
  CBS_init(&output, out.data(), out.size());
  if (!CBS_get_u24_length_prefixed(&output, &handback) ||
      !DeserializeContextState(&output, ctx) ||
      !SetTestState(ssl_handback.get(), TestState::Deserialize(&output, ctx)) ||
      !GetTestState(ssl_handback.get()) || !writer->WriteHandback(handback) ||
      !SSL_apply_handback(ssl_handback.get(), handback)) {
    fprintf(stderr, "Handback failed.\n");
    return false;
  }
  MoveBIOs(ssl_handback.get(), ssl->get());
  GetTestState(ssl_handback.get())->async_bio =
      GetTestState(ssl->get())->async_bio;
  GetTestState(ssl->get())->async_bio = nullptr;

  *ssl = std::move(ssl_handback);
  return true;
}